

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert(string *v,RepType *r)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  RealType RVar3;
  StringTokenizer tokenizer;
  allocator_type local_a1;
  value_type_conflict2 local_a0;
  string local_98;
  StringTokenizer local_78;
  
  std::operator<<((ostream *)&std::cerr,"calling tokenizer\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98," ();,\t\n\r",(allocator<char> *)&local_a0);
  OpenMD::StringTokenizer::StringTokenizer(&local_78,v,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  uVar1 = OpenMD::StringTokenizer::countTokens(&local_78);
  local_a0 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_98,(ulong)uVar1,&local_a0,&local_a1);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(r,&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_98);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    RVar3 = OpenMD::StringTokenizer::nextTokenAsDouble(&local_78);
    (r->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar2] = RVar3;
  }
  OpenMD::StringTokenizer::~StringTokenizer(&local_78);
  return true;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    std::cerr << "calling tokenizer\n";
    OpenMD::StringTokenizer tokenizer(v, " ();,\t\n\r");
    unsigned int size = tokenizer.countTokens();
    r                 = std::vector<RealType>(size, 0.0);
    for (unsigned int i = 0; i < size; i++) {
      RealType v = tokenizer.nextTokenAsDouble();
      r[i]       = v;
    }
    return true;
  }